

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# whisper.cpp
# Opt level: O0

whisper_context * whisper_init_from_file_with_params(char *path_model,whisper_context_params params)

{
  whisper_state *pwVar1;
  whisper_context *ctx;
  char *in_stack_00000238;
  whisper_context_params in_stack_00000250;
  whisper_context *in_stack_00001598;
  undefined1 local_48 [8];
  whisper_context *in_stack_ffffffffffffffc0;
  whisper_context *local_8;
  
  memcpy(local_48,&stack0x00000008,0x30);
  local_8 = whisper_init_from_file_with_params_no_state(in_stack_00000238,in_stack_00000250);
  if (local_8 == (whisper_context *)0x0) {
    local_8 = (whisper_context *)0x0;
  }
  else {
    pwVar1 = whisper_init_state(in_stack_00001598);
    local_8->state = pwVar1;
    if (local_8->state == (whisper_state *)0x0) {
      whisper_free(in_stack_ffffffffffffffc0);
      local_8 = (whisper_context *)0x0;
    }
  }
  return local_8;
}

Assistant:

struct whisper_context * whisper_init_from_file_with_params(const char * path_model, struct whisper_context_params params) {
    whisper_context * ctx = whisper_init_from_file_with_params_no_state(path_model, params);
    if (!ctx) {
        return nullptr;
    }

    ctx->state = whisper_init_state(ctx);
    if (!ctx->state) {
        whisper_free(ctx);
        return nullptr;
    }

    return ctx;
}